

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Counter.cxx
# Opt level: O2

int __thiscall Fl_Counter::handle(Fl_Counter *this,int event)

{
  Fl_Widget_Tracker FVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  double dVar5;
  Fl_Widget_Tracker wp;
  
  iVar2 = 1;
  switch(event) {
  case 1:
    iVar3 = Fl::visible_focus();
    if (iVar3 != 0) {
      Fl::focus((Fl_Widget *)this);
    }
    Fl_Widget_Tracker::Fl_Widget_Tracker(&wp,(Fl_Widget *)this);
    FVar1 = wp;
    (this->super_Fl_Valuator).previous_value_ = (this->super_Fl_Valuator).value_;
    Fl_Widget_Tracker::~Fl_Widget_Tracker(&wp);
    if (FVar1.wp_ == (Fl_Widget *)0x0) {
      return 1;
    }
  case 5:
    uVar4 = calc_mouseobj(this);
    if (uVar4 != this->mouseobj) {
      Fl::remove_timeout(repeat_callback,this);
      this->mouseobj = (uchar)uVar4;
      if (uVar4 != 0) {
        Fl::add_timeout(0.5,repeat_callback,this);
      }
      Fl_Widget_Tracker::Fl_Widget_Tracker(&wp,(Fl_Widget *)this);
      increment_cb(this);
      if (wp.wp_ != (Fl_Widget *)0x0) {
        Fl_Widget::redraw((Fl_Widget *)this);
      }
      Fl_Widget_Tracker::~Fl_Widget_Tracker(&wp);
    }
    break;
  case 2:
    if (this->mouseobj != '\0') {
      Fl::remove_timeout(repeat_callback,this);
      this->mouseobj = '\0';
      Fl_Widget::redraw((Fl_Widget *)this);
    }
    Fl_Valuator::handle_release(&this->super_Fl_Valuator);
    break;
  case 3:
  case 4:
    break;
  case 6:
  case 7:
    iVar2 = Fl::visible_focus();
    if (iVar2 != 0) {
      Fl_Widget::redraw((Fl_Widget *)this);
      return 1;
    }
  default:
switchD_001aa6fd_default:
    iVar2 = 0;
    break;
  case 8:
    if (Fl::e_keysym == 0xff53) {
      dVar5 = (this->super_Fl_Valuator).value_;
      iVar3 = iVar2;
    }
    else {
      if (Fl::e_keysym != 0xff51) goto switchD_001aa6fd_default;
      dVar5 = (this->super_Fl_Valuator).value_;
      iVar3 = -1;
    }
    dVar5 = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar5,iVar3);
    dVar5 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar5);
    Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar5);
  }
  return iVar2;
}

Assistant:

int Fl_Counter::handle(int event) {
  int i;
  switch (event) {
  case FL_RELEASE:
    if (mouseobj) {
      Fl::remove_timeout(repeat_callback, this);
      mouseobj = 0;
      redraw();
    }
    handle_release();
    return 1;
  case FL_PUSH:
    if (Fl::visible_focus()) Fl::focus(this);
    { Fl_Widget_Tracker wp(this);
      handle_push();
      if (wp.deleted()) return 1;
    }
  case FL_DRAG:
    i = calc_mouseobj();
    if (i != mouseobj) {
      Fl::remove_timeout(repeat_callback, this);
      mouseobj = (uchar)i;
      if (i) Fl::add_timeout(INITIALREPEAT, repeat_callback, this);
      Fl_Widget_Tracker wp(this);
      increment_cb();
      if (wp.deleted()) return 1;
      redraw();
    }
    return 1;
  case FL_KEYBOARD :
    switch (Fl::event_key()) {
      case FL_Left:
	handle_drag(clamp(increment(value(),-1)));
	return 1;
      case FL_Right:
	handle_drag(clamp(increment(value(),1)));
	return 1;
      default:
        return 0;
    }
    // break not required because of switch...
  case FL_FOCUS : /* FALLTHROUGH */
  case FL_UNFOCUS :
    if (Fl::visible_focus()) {
      redraw();
      return 1;
    } else return 0;
  case FL_ENTER : /* FALLTHROUGH */
  case FL_LEAVE :
    return 1;
  default:
    return 0;
  }
}